

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O0

void ggml_compute_forward_flash_attn_ext
               (ggml_compute_params *params,ggml_tensor *q,ggml_tensor *k,ggml_tensor *v,
               ggml_tensor *mask,ggml_tensor *dst)

{
  long in_R9;
  ggml_tensor *in_stack_00000248;
  ggml_tensor *in_stack_00000250;
  ggml_tensor *in_stack_00000258;
  ggml_tensor *in_stack_00000260;
  ggml_tensor *in_stack_00000268;
  ggml_compute_params *in_stack_00000270;
  
  if (*(uint *)(in_R9 + 0x60) < 2) {
    ggml_compute_forward_flash_attn_ext_f16
              (in_stack_00000270,in_stack_00000268,in_stack_00000260,in_stack_00000258,
               in_stack_00000250,in_stack_00000248);
  }
  else {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,0x1bb5,"fatal error");
  }
  return;
}

Assistant:

void ggml_compute_forward_flash_attn_ext(
        const ggml_compute_params * params,
        const ggml_tensor * q,
        const ggml_tensor * k,
        const ggml_tensor * v,
        const ggml_tensor * mask,
        ggml_tensor * dst) {
    switch (dst->op_params[3]) {
        case GGML_PREC_DEFAULT:
        case GGML_PREC_F32:
            {
                // uses F32 accumulators
                ggml_compute_forward_flash_attn_ext_f16(params, q, k, v, mask, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}